

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<Fad<double>_>::AddKel
          (TPZMatrix<Fad<double>_> *this,TPZFMatrix<Fad<double>_> *elmat,TPZVec<long> *source,
          TPZVec<long> *destinationindex)

{
  int iVar1;
  long *plVar2;
  Fad<double> *this_00;
  Fad<double> *x;
  long *col;
  double *pdVar3;
  TPZVec<long> *in_RCX;
  TPZVec<long> *in_RDX;
  long *in_RDI;
  Fad<double> prevval;
  int64_t jeqs;
  int64_t ieqs;
  int64_t jeq;
  int64_t ieq;
  int64_t jcoef;
  int64_t icoef;
  int64_t nelem;
  Fad<double> *in_stack_fffffffffffffed8;
  Fad<double> *in_stack_fffffffffffffee0;
  Fad<double> *in_stack_fffffffffffffef0;
  int64_t in_stack_fffffffffffffef8;
  TPZFMatrix<Fad<double>_> *in_stack_ffffffffffffff00;
  Fad<double> *in_stack_ffffffffffffff08;
  Fad<double> *in_stack_ffffffffffffff10;
  undefined1 local_c8 [32];
  undefined1 local_a8 [48];
  undefined1 local_78 [32];
  double local_58;
  long local_50;
  double local_48;
  long local_40;
  long local_38;
  long local_30;
  int64_t local_28;
  TPZVec<long> *local_20;
  TPZVec<long> *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_28 = TPZVec<long>::NElements(in_RDX);
  Fad<double>::Fad(in_stack_fffffffffffffef0);
  iVar1 = (**(code **)(*in_RDI + 0x80))();
  if (iVar1 == 0) {
    for (local_30 = 0; local_30 < local_28; local_30 = local_30 + 1) {
      plVar2 = TPZVec<long>::operator[](local_20,local_30);
      local_40 = *plVar2;
      col = TPZVec<long>::operator[](local_18,local_30);
      local_50 = *col;
      for (local_38 = 0; local_38 < local_28; local_38 = local_38 + 1) {
        pdVar3 = (double *)TPZVec<long>::operator[](local_20,local_38);
        local_48 = *pdVar3;
        in_stack_fffffffffffffee0 = (Fad<double> *)TPZVec<long>::operator[](local_18,local_38);
        local_58 = in_stack_fffffffffffffee0->val_;
        (**(code **)(*in_RDI + 0x120))(local_c8,in_RDI,local_40,local_48);
        Fad<double>::operator=(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
        Fad<double>::~Fad(in_stack_fffffffffffffee0);
        in_stack_fffffffffffffed8 =
             TPZFMatrix<Fad<double>_>::operator()
                       (in_stack_ffffffffffffff00,(int64_t)plVar2,(int64_t)col);
        Fad<double>::operator+=<double,_nullptr>
                  (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        (**(code **)(*in_RDI + 0x118))(in_RDI,local_40,local_48,local_78);
      }
    }
  }
  else {
    for (local_30 = 0; local_30 < local_28; local_30 = local_30 + 1) {
      plVar2 = TPZVec<long>::operator[](local_20,local_30);
      local_40 = *plVar2;
      plVar2 = TPZVec<long>::operator[](local_18,local_30);
      local_50 = *plVar2;
      for (local_38 = local_30; local_38 < local_28; local_38 = local_38 + 1) {
        this_00 = (Fad<double> *)TPZVec<long>::operator[](local_20,local_38);
        local_48 = this_00->val_;
        x = (Fad<double> *)TPZVec<long>::operator[](local_18,local_38);
        local_58 = x->val_;
        (**(code **)(*in_RDI + 0x120))(local_a8,in_RDI,local_40,local_48);
        Fad<double>::operator=(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
        Fad<double>::~Fad(in_stack_fffffffffffffee0);
        in_stack_ffffffffffffff00 =
             (TPZFMatrix<Fad<double>_> *)
             TPZFMatrix<Fad<double>_>::operator()
                       (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                        (int64_t)in_stack_fffffffffffffef0);
        Fad<double>::operator+=<double,_nullptr>(this_00,x);
        (**(code **)(*in_RDI + 0x118))(in_RDI,local_40,local_48,local_78);
      }
    }
  }
  Fad<double>::~Fad(in_stack_fffffffffffffee0);
  return;
}

Assistant:

void TPZMatrix<TVar>::AddKel(TPZFMatrix<TVar> &elmat, TPZVec<int64_t> &source, TPZVec<int64_t> &destinationindex) {
	
	int64_t nelem = source.NElements();
  	int64_t icoef,jcoef,ieq,jeq,ieqs,jeqs;
    TVar prevval;
	if(IsSymmetric()) {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			ieqs = source[icoef];
			for(jcoef=icoef; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				jeqs = source[jcoef];
				prevval = GetVal(ieq,jeq);
				prevval += elmat(ieqs,jeqs);
				PutVal(ieq,jeq,prevval);
			}
		}
	} else {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			ieqs = source[icoef];
			for(jcoef=0; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				jeqs = source[jcoef];
				prevval = GetVal(ieq,jeq);
				prevval += elmat(ieqs,jeqs);
				PutVal(ieq,jeq,prevval);
			}
		}
	}
}